

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Context.cpp
# Opt level: O2

bool __thiscall sf::Context::setActive(Context *this,bool active)

{
  bool bVar1;
  Context *value;
  
  bVar1 = priv::GlContext::setActive(this->m_context,active);
  if (bVar1) {
    value = (Context *)0x0;
    if (active) {
      value = this;
    }
    ThreadLocal::setValue((ThreadLocal *)&(anonymous_namespace)::currentContext,value);
  }
  return bVar1;
}

Assistant:

bool Context::setActive(bool active)
{
    bool result = m_context->setActive(active);

    if (result)
        currentContext = (active ? this : NULL);

    return result;
}